

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

type * __thiscall
linalg::detail::apply<linalg::detail::op_mul,void,linalg::vec<double,4>,linalg::vec<double,4>>::
impl<0,1,2,3>(vec<double,_4> *__return_storage_ptr__,
             apply<linalg::detail::op_mul,void,linalg::vec<double,4>,linalg::vec<double,4>> *this,
             vec<double,_4> *param_3)

{
  double dVar1;
  double dVar2;
  getter<3> local_5a;
  getter<3> local_59;
  double local_58;
  getter<2> local_4a;
  getter<2> local_49;
  double local_48;
  getter<1> local_3a;
  getter<1> local_39;
  double local_38;
  getter<0> local_2a;
  getter<0> local_29;
  double local_28;
  vec<double,_4> *local_20;
  vec<double,_4> *b_local;
  vec<double,_4> *a_local;
  
  local_20 = param_3;
  b_local = (vec<double,_4> *)this;
  dVar1 = getter<0>::operator()(&local_29,(vec<double,_4> *)this);
  dVar2 = getter<0>::operator()(&local_2a,local_20);
  local_28 = op_mul::operator()((op_mul *)((long)&a_local + 6),dVar1,dVar2);
  dVar1 = getter<1>::operator()(&local_39,b_local);
  dVar2 = getter<1>::operator()(&local_3a,local_20);
  local_38 = op_mul::operator()((op_mul *)((long)&a_local + 6),dVar1,dVar2);
  dVar1 = getter<2>::operator()(&local_49,b_local);
  dVar2 = getter<2>::operator()(&local_4a,local_20);
  local_48 = op_mul::operator()((op_mul *)((long)&a_local + 6),dVar1,dVar2);
  dVar1 = getter<3>::operator()(&local_59,b_local);
  dVar2 = getter<3>::operator()(&local_5a,local_20);
  local_58 = op_mul::operator()((op_mul *)((long)&a_local + 6),dVar1,dVar2);
  vec<double,_4>::vec(__return_storage_ptr__,&local_28,&local_38,&local_48,&local_58);
  return __return_storage_ptr__;
}

Assistant:

static constexpr type impl(seq<I...>, F f, A                a, const vec<B,M> & b                    ) { return {f(a,              getter<I>{}(b)                )...}; }